

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3UpsertDoUpdate(Parse *pParse,Upsert *pUpsert,Table *pTab,Index *pIdx,int iCur)

{
  ushort uVar1;
  sqlite3 *db;
  Vdbe *p;
  byte bVar2;
  int iVar3;
  Parse *pPVar4;
  SrcList *pTabList;
  ExprList *pChanges;
  Expr *pWhere;
  uint uVar5;
  Op *pOVar6;
  Upsert *pOrderBy;
  short *psVar7;
  int p2;
  Index *pIVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  Expr *in_stack_00000008;
  Upsert *in_stack_00000010;
  
  iVar3 = pUpsert->iDataCur;
  pOrderBy = pUpsert;
  if (pUpsert != (Upsert *)0x0) {
    do {
      if ((pOrderBy->pUpsertTarget == (ExprList *)0x0) || (pOrderBy->pUpsertIdx == pIdx)) break;
      pOrderBy = pOrderBy->pNextUpsert;
    } while (pOrderBy != (Upsert *)0x0);
  }
  db = pParse->db;
  p = pParse->pVdbe;
  if (iVar3 != iCur && pIdx != (Index *)0x0) {
    if ((pTab->tabFlags & 0x80) == 0) {
      if (pParse->nTempReg == '\0') {
        iVar12 = pParse->nMem + 1;
        pParse->nMem = iVar12;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar12 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(p,0x8e,iCur,iVar12,0);
      sqlite3VdbeAddOp3(p,0x1e,iVar3,0,iVar12);
      if (iVar12 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar12;
        }
      }
    }
    else {
      for (pIVar8 = pTab->pIndex;
          (pIVar8 != (Index *)0x0 && ((*(ushort *)&pIVar8->field_0x63 & 3) != 2));
          pIVar8 = pIVar8->pNext) {
      }
      uVar1 = pIVar8->nKeyCol;
      iVar12 = pParse->nMem + 1;
      uVar5 = (uint)uVar1;
      pParse->nMem = pParse->nMem + uVar5;
      if (uVar1 != 0) {
        uVar10 = 0;
        do {
          p2 = -1;
          if (pIdx->nColumn != 0) {
            psVar7 = pIdx->aiColumn;
            lVar9 = 0;
            do {
              if (*psVar7 == pIVar8->aiColumn[uVar10]) {
                p2 = (int)lVar9 >> 0x10;
                break;
              }
              lVar9 = lVar9 + 0x10000;
              psVar7 = psVar7 + 1;
            } while ((ulong)pIdx->nColumn * 0x10000 != lVar9);
          }
          sqlite3VdbeAddOp3(p,0x5e,iCur,p2,iVar12 + (int)uVar10);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar5);
      }
      iVar3 = sqlite3VdbeAddOp3(p,0x1d,iVar3,0,iVar12);
      if (p->db->mallocFailed == '\0') {
        pOVar6 = p->aOp;
        pOVar6[iVar3].p4type = -3;
        pOVar6[iVar3].p4.i = uVar5;
      }
      iVar12 = sqlite3VdbeAddOp3(p,0x46,0xb,2,0);
      sqlite3VdbeChangeP4(p,iVar12,"corrupt database",-1);
      pPVar4 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar4 = pParse;
      }
      pPVar4->mayAbort = '\x01';
      if (p->db->mallocFailed == '\0') {
        pOVar6 = p->aOp + iVar3;
      }
      else {
        pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar6->p2 = p->nOp;
    }
  }
  pTabList = sqlite3SrcListDup(db,pUpsert->pUpsertSrc,0);
  if (0 < pTab->nCol) {
    lVar9 = 9;
    lVar11 = 0;
    do {
      if (*(char *)((long)&pTab->aCol->zCnName + lVar9) == 'E') {
        sqlite3VdbeAddOp3(p,0x57,pUpsert->regData + (int)lVar11,0,0);
      }
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar11 < pTab->nCol);
  }
  pWhere = (Expr *)0x0;
  pChanges = sqlite3ExprListDup(db,pOrderBy->pUpsertSet,0);
  if (*(Expr **)&pOrderBy->pUpsertWhere != (Expr *)0x0) {
    pWhere = exprDup(db,*(Expr **)&pOrderBy->pUpsertWhere,0,(u8 **)0x0);
  }
  sqlite3Update(pParse,pTabList,pChanges,pWhere,2,(ExprList *)pOrderBy,in_stack_00000008,
                in_stack_00000010);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UpsertDoUpdate(
  Parse *pParse,        /* The parsing and code-generating context */
  Upsert *pUpsert,      /* The ON CONFLICT clause for the upsert */
  Table *pTab,          /* The table being updated */
  Index *pIdx,          /* The UNIQUE constraint that failed */
  int iCur              /* Cursor for pIdx (or pTab if pIdx==NULL) */
){
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;
  SrcList *pSrc;            /* FROM clause for the UPDATE */
  int iDataCur;
  int i;
  Upsert *pTop = pUpsert;

  assert( v!=0 );
  assert( pUpsert!=0 );
  iDataCur = pUpsert->iDataCur;
  pUpsert = sqlite3UpsertOfIndex(pTop, pIdx);
  VdbeNoopComment((v, "Begin DO UPDATE of UPSERT"));
  if( pIdx && iCur!=iDataCur ){
    if( HasRowid(pTab) ){
      int regRowid = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_IdxRowid, iCur, regRowid);
      sqlite3VdbeAddOp3(v, OP_SeekRowid, iDataCur, 0, regRowid);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regRowid);
    }else{
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      int nPk = pPk->nKeyCol;
      int iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      for(i=0; i<nPk; i++){
        int k;
        assert( pPk->aiColumn[i]>=0 );
        k = sqlite3TableColumnToIndex(pIdx, pPk->aiColumn[i]);
        sqlite3VdbeAddOp3(v, OP_Column, iCur, k, iPk+i);
        VdbeComment((v, "%s.%s", pIdx->zName,
                    pTab->aCol[pPk->aiColumn[i]].zCnName));
      }
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      i = sqlite3VdbeAddOp4Int(v, OP_Found, iDataCur, 0, iPk, nPk);
      VdbeCoverage(v);
      sqlite3VdbeAddOp4(v, OP_Halt, SQLITE_CORRUPT, OE_Abort, 0,
            "corrupt database", P4_STATIC);
      sqlite3MayAbort(pParse);
      sqlite3VdbeJumpHere(v, i);
    }
  }
  /* pUpsert does not own pTop->pUpsertSrc - the outer INSERT statement does.
  ** So we have to make a copy before passing it down into sqlite3Update() */
  pSrc = sqlite3SrcListDup(db, pTop->pUpsertSrc, 0);
  /* excluded.* columns of type REAL need to be converted to a hard real */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
      sqlite3VdbeAddOp1(v, OP_RealAffinity, pTop->regData+i);
    }
  }
  sqlite3Update(pParse, pSrc, sqlite3ExprListDup(db,pUpsert->pUpsertSet,0),
      sqlite3ExprDup(db,pUpsert->pUpsertWhere,0), OE_Abort, 0, 0, pUpsert);
  VdbeNoopComment((v, "End DO UPDATE of UPSERT"));
}